

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

void __thiscall QByteArray::QByteArray(QByteArray *this,char *data,qsizetype size)

{
  char *pcVar1;
  QArrayDataPointer<char> *in_RDX;
  void *in_RSI;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char> *alloc;
  QArrayDataPointer<char> *in_stack_ffffffffffffffb0;
  QArrayDataPointer<char> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  alloc = in_RDI;
  QArrayDataPointer<char>::QArrayDataPointer(in_RDI);
  if (in_RSI == (void *)0x0) {
    QArrayDataPointer<char>::QArrayDataPointer(&local_20);
    QArrayDataPointer<char>::operator=(in_RDX,in_RDI);
    QArrayDataPointer<char>::~QArrayDataPointer(in_RDI);
  }
  else {
    if ((long)in_RDX < 0) {
      in_RDX = (QArrayDataPointer<char> *)qstrlen((char *)in_RDI);
    }
    if (in_RDX == (QArrayDataPointer<char> *)0x0) {
      QArrayDataPointer<char>::fromRawData((char *)0x0,(qsizetype)in_RDI);
      QArrayDataPointer<char>::operator=(in_RDX,in_RDI);
      QArrayDataPointer<char>::~QArrayDataPointer(in_RDI);
    }
    else {
      QArrayDataPointer<char>::QArrayDataPointer
                (in_stack_ffffffffffffffb0,(qsizetype)alloc,(qsizetype)in_RSI,
                 (AllocationOption)((ulong)in_RDX >> 0x20));
      QArrayDataPointer<char>::operator=(in_RDX,in_RDI);
      QArrayDataPointer<char>::~QArrayDataPointer(in_RDI);
      qt_noop();
      pcVar1 = QArrayDataPointer<char>::data(in_RDI);
      memcpy(pcVar1,in_RSI,(size_t)in_RDX);
      pcVar1 = QArrayDataPointer<char>::data(in_RDI);
      pcVar1[(long)in_RDX] = '\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QByteArray::QByteArray(const char *data, qsizetype size)
{
    if (!data) {
        d = DataPointer();
    } else {
        if (size < 0)
            size = qstrlen(data);
        if (!size) {
            d = DataPointer::fromRawData(&_empty, 0);
        } else {
            d = DataPointer(size, size);
            Q_CHECK_PTR(d.data());
            memcpy(d.data(), data, size);
            d.data()[size] = '\0';
        }
    }
}